

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_ops.c
# Opt level: O0

long lookup_gnu_hash_symbol
               (char *name,Elf64_Sym *syms,Elf64_Half *versym,char *symnames,void *sheader)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint32_t uVar4;
  int iVar5;
  gnu_hash_header *header;
  char *pcStack_60;
  Elf64_Half latest_sym_ver;
  long latest_sym;
  uint local_50;
  uint32_t cur_sym_hashval;
  uint32_t cur_sym;
  uint32_t hash_val;
  uint32_t *vals;
  uint32_t *buckets;
  void *sheader_local;
  char *symnames_local;
  Elf64_Half *versym_local;
  Elf64_Sym *syms_local;
  char *name_local;
  
  pcStack_60 = (char *)0xffffffffffffffff;
  header._6_2_ = 0;
  lVar3 = (ulong)*(uint *)((long)sheader + 8) * 8 + 0x10;
  uVar1 = *sheader;
  uVar4 = gnu_hash_func(name);
  local_50 = *(uint *)((long)sheader + ((ulong)uVar4 % (ulong)*sheader) * 4 + lVar3);
  if (local_50 == 0) {
    name_local = (char *)0xffffffffffffffff;
  }
  else {
    while( true ) {
      uVar2 = *(uint *)((long)sheader +
                       (ulong)(local_50 - *(int *)((long)sheader + 4)) * 4 +
                       (ulong)uVar1 * 4 + lVar3);
      if (((uVar2 & 0xfffffffe) == (uVar4 & 0xfffffffe)) &&
         (iVar5 = strcmp(name,symnames + syms[local_50].st_name), iVar5 == 0)) {
        if (versym == (Elf64_Half *)0x0) {
          return (ulong)local_50;
        }
        if (header._6_2_ < (versym[local_50] & 0x7fff)) {
          pcStack_60 = (char *)(ulong)local_50;
          header._6_2_ = versym[local_50] & 0x7fff;
        }
      }
      if ((uVar2 & 1) != 0) break;
      local_50 = local_50 + 1;
    }
    name_local = pcStack_60;
  }
  return (long)name_local;
}

Assistant:

signed long lookup_gnu_hash_symbol(const char *name, ElfW(Sym) * syms,
                                   ElfW(Half) * versym, char *symnames,
                                   void *sheader) {
  uint32_t *buckets = NULL, *vals = NULL;
  uint32_t hash_val = 0;
  uint32_t cur_sym = 0, cur_sym_hashval = 0;
  signed long latest_sym = -1;
  ElfW(Half) latest_sym_ver = 0;
  struct gnu_hash_header *header = (struct gnu_hash_header *)(sheader);

  buckets = (uint32_t *)(((unsigned char *)(header + 1)) +
                         (header->maskwords * sizeof(ElfW(Addr))));
  vals = buckets + header->nbuckets;

  hash_val = gnu_hash_func(name);
  cur_sym = buckets[hash_val % header->nbuckets];
  if (cur_sym == 0) {
    return -1;
  }

  hash_val &= ~1;
  for (;;) {
    cur_sym_hashval = vals[cur_sym - header->symndx];
    if (((cur_sym_hashval & ~1) == hash_val) &&
        (gotcha_strcmp(name, symnames + syms[cur_sym].st_name) == 0)) {
      if (!versym) {
        return (signed long)cur_sym;
      }

      if ((versym[cur_sym] & 0x7fff) > latest_sym_ver) {
        latest_sym = (signed long)cur_sym;
        latest_sym_ver = versym[cur_sym] & 0x7fff;
      }
    }
    if (cur_sym_hashval & 1) {
      break;
    }
    cur_sym++;
  }

  return latest_sym;
}